

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O1

void __thiscall Options::~Options(Options *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  
  paVar2 = &(this->reportFields).linkFields[8].units.field_2;
  lVar3 = -0x318;
  do {
    pcVar1 = (((string *)(paVar2 + -1))->_M_dataplus)._M_p;
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar1) {
      operator_delete(pcVar1);
    }
    if (paVar2 + -2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)paVar2[-3]._M_allocated_capacity) {
      operator_delete((void *)paVar2[-3]._M_allocated_capacity);
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar2 + -0x58);
    lVar3 = lVar3 + 0x58;
  } while (lVar3 != 0);
  paVar2 = &(this->reportFields).nodeFields[6].units.field_2;
  lVar3 = -0x268;
  do {
    pcVar1 = (((string *)(paVar2 + -1))->_M_dataplus)._M_p;
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar1) {
      operator_delete(pcVar1);
    }
    if (paVar2 + -2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)paVar2[-3]._M_allocated_capacity) {
      operator_delete((void *)paVar2[-3]._M_allocated_capacity);
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar2 + -0x58);
    lVar3 = lVar3 + 0x58;
  } while (lVar3 != 0);
  paVar2 = &this->stringOptions[0xe].field_2;
  lVar3 = -0x1e0;
  do {
    pcVar1 = (((string *)(paVar2 + -1))->_M_dataplus)._M_p;
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar1) {
      operator_delete(pcVar1);
    }
    paVar2 = paVar2 + -2;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  return;
}

Assistant:

~Options() {}